

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuplesContactN.h
# Opt level: O2

void __thiscall
chrono::
ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
::Project(ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
          *this)

{
  double dVar1;
  double dVar2;
  ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  *pCVar3;
  ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
  *pCVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pCVar3 = this->constraint_U;
  if ((pCVar3 != (ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
                  *)0x0) &&
     (pCVar4 = this->constraint_V,
     pCVar4 != (ChConstraintTwoTuplesFrictionT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
                *)0x0)) {
    dVar11 = *(double *)
              &(this->
               super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
               ).field_0xf8;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar11;
    dVar9 = *(double *)&this->field_0x100 +
            (this->
            super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
            ).super_ChConstraint.l_i;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      auVar8._8_8_ = 0x7fffffffffffffff;
      auVar8._0_8_ = 0x7fffffffffffffff;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar9;
      auVar8 = vandpd_avx512vl(auVar10,auVar8);
      if (1e-14 <= auVar8._0_8_) {
        dVar5 = dVar11 * dVar11;
        dVar1 = (pCVar3->
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
                ).super_ChConstraint.l_i;
        dVar2 = (pCVar4->
                super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
                ).super_ChConstraint.l_i;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar2;
        uVar6 = vcmppd_avx512vl(auVar10,ZEXT816(0) << 0x40,2);
        auVar15._0_8_ = (dVar9 * dVar9) / dVar5;
        auVar15._8_8_ = 0;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar1 * dVar1;
        auVar8 = vfmadd231sd_fma(auVar14,auVar13,auVar13);
        uVar7 = vcmppd_avx512vl(auVar8,auVar15,1);
        if (((uint)((byte)uVar6 & 3) & (uint)uVar7 & 1) == 0) {
          if (auVar8._0_8_ < dVar9 * dVar9 * dVar5) {
            return;
          }
          auVar8 = vsqrtsd_avx(auVar8,auVar8);
          auVar12 = vfmadd231sd_fma(auVar10,auVar8,auVar12);
          dVar9 = auVar12._0_8_ / (dVar5 + 1.0);
          dVar11 = (dVar11 * dVar9) / auVar8._0_8_;
          (this->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
          ).super_ChConstraint.l_i = dVar9 - *(double *)&this->field_0x100;
          (pCVar3->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
          ).super_ChConstraint.l_i = dVar1 * dVar11;
          (pCVar4->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
          ).super_ChConstraint.l_i = dVar2 * dVar11;
          return;
        }
      }
      (this->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
      ).super_ChConstraint.l_i = 0.0;
      (pCVar3->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
      ).super_ChConstraint.l_i = 0.0;
      (pCVar4->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
      ).super_ChConstraint.l_i = 0.0;
      return;
    }
    (pCVar3->
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    ).super_ChConstraint.l_i = 0.0;
    (pCVar4->
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    ).super_ChConstraint.l_i = 0.0;
    if (dVar9 < 0.0) {
      (this->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
      ).super_ChConstraint.l_i = 0.0;
      return;
    }
  }
  return;
}

Assistant:

virtual void Project() override {
        if (!constraint_U || !constraint_V)
            return;

        // Anitescu-Tasora projection on cone generator and polar cone
        // (contractive, but performs correction on three components: normal,u,v)

        double f_n = this->l_i + this->cohesion;

		// no friction? project to axis of upper cone
        if (friction == 0) {
            constraint_U->Set_l_i(0);
            constraint_V->Set_l_i(0);
            if (f_n < 0)
                this->Set_l_i(0);
            return;
        }

        double f_u = constraint_U->Get_l_i();
        double f_v = constraint_V->Get_l_i();

        double mu2 = friction * friction;
        double f_n2 = f_n * f_n;
        double f_t2 = (f_v * f_v + f_u * f_u);

        // inside lower cone or close to origin? reset normal, u, v to zero!
        if ((f_n <= 0 && f_t2 < f_n2 / mu2) || (f_n < 1e-14 && f_n > -1e-14)) {
            this->Set_l_i(0);
            constraint_U->Set_l_i(0);
            constraint_V->Set_l_i(0);
            return;
        }

        // inside upper cone? keep untouched!
        if (f_t2 < f_n2 * mu2)
            return;

        // project orthogonally to generator segment of upper cone
        double f_t = sqrt(f_t2);
		double f_n_proj = (f_t * friction + f_n) / (mu2 + 1);
        double f_t_proj = f_n_proj * friction;
        double tproj_div_t = f_t_proj / f_t;
        double f_u_proj = tproj_div_t * f_u;
        double f_v_proj = tproj_div_t * f_v;

        this->Set_l_i(f_n_proj - this->cohesion);
        constraint_U->Set_l_i(f_u_proj);
        constraint_V->Set_l_i(f_v_proj);
    }